

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intermediate_code.cpp
# Opt level: O1

void __thiscall Temp::Temp(Temp *this,char *name)

{
  int iVar1;
  size_t sVar2;
  char *pcVar3;
  char name_aux [250];
  char acStack_118 [264];
  
  this->_vptr_Temp = (_func_int **)&PTR__Temp_001252e0;
  iVar1 = strcmp(name,"NotDefined");
  if (iVar1 != 0) {
    sVar2 = strlen(name);
    pcVar3 = (char *)operator_new__(sVar2 + 1);
    this->name = pcVar3;
    strcpy(pcVar3,name);
    return;
  }
  num_temps = num_temps + 1;
  sprintf(acStack_118,"$%d");
  sVar2 = strlen(acStack_118);
  pcVar3 = (char *)operator_new__(sVar2 + 1);
  this->name = pcVar3;
  strcpy(pcVar3,acStack_118);
  return;
}

Assistant:

Temp::Temp(const char *name) {
    if(strcmp(name, "NotDefined")!=0)
    {
        this->name = new char[strlen(name) + 1];
        strcpy(this->name, name);
    }else
    {
        char name_aux[250];
        sprintf(name_aux, "$%d", num_temps++);
        this->name = new char[strlen(name_aux) + 1];
        strcpy(this->name, name_aux);
    }
}